

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O3

bool __thiscall duckdb::QueryResult::Equals(QueryResult *this,QueryResult *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  pointer pDVar5;
  ulong col_idx;
  pointer rhs;
  idx_t index;
  pointer this_00;
  idx_t index_00;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> lchunk;
  Value lvalue;
  Value rvalue;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_c0;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_b8;
  Value local_b0;
  Value local_70;
  
  bVar4 = (this->super_BaseQueryResult).success;
  if (bVar4 == (other->super_BaseQueryResult).success) {
    if (bVar4 == false) {
      bVar4 = ErrorData::operator==
                        (&(this->super_BaseQueryResult).error,&(other->super_BaseQueryResult).error)
      ;
      return bVar4;
    }
    __first1 = (this->super_BaseQueryResult).names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (this->super_BaseQueryResult).names.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (other->super_BaseQueryResult).names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 ==
         (long)(other->super_BaseQueryResult).names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
       (bVar4 = ::std::__equal<false>::
                equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (__first1,__last1,__first2), bVar4)) {
      this_00 = (this->super_BaseQueryResult).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pLVar1 = (this->super_BaseQueryResult).types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      rhs = (other->super_BaseQueryResult).types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
      if ((long)pLVar1 - (long)this_00 ==
          (long)(other->super_BaseQueryResult).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)rhs) {
        if (this_00 != pLVar1) {
          do {
            bVar4 = LogicalType::operator==(this_00,rhs);
            if (!bVar4) break;
            this_00 = this_00 + 1;
            rhs = rhs + 1;
          } while (this_00 != pLVar1);
          if (!bVar4) {
            return false;
          }
        }
        local_b8._M_head_impl = (DataChunk *)0x0;
        local_c0._M_head_impl = (DataChunk *)0x0;
        index_00 = 0;
        index = 0;
        while( true ) {
          if ((local_b8._M_head_impl == (DataChunk *)0x0) ||
             (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                   *)&local_b8), index_00 == pDVar5->count)) {
            (*(this->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&local_b0,this);
            uVar3 = local_b0.type_._0_8_;
            _Var2._M_head_impl = local_b8._M_head_impl;
            local_b0.type_._0_8_ = (DataChunk *)0x0;
            local_b8._M_head_impl = (DataChunk *)uVar3;
            if (_Var2._M_head_impl != (DataChunk *)0x0) {
              DataChunk::~DataChunk(_Var2._M_head_impl);
              operator_delete(_Var2._M_head_impl);
              uVar3 = local_b0.type_._0_8_;
              if ((DataChunk *)local_b0.type_._0_8_ != (DataChunk *)0x0) {
                DataChunk::~DataChunk((DataChunk *)local_b0.type_._0_8_);
                operator_delete((void *)uVar3);
              }
            }
            index_00 = 0;
          }
          if ((local_c0._M_head_impl == (DataChunk *)0x0) ||
             (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                   *)&local_c0), index == pDVar5->count)) {
            (*(other->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&local_b0,other);
            uVar3 = local_b0.type_._0_8_;
            _Var2._M_head_impl = local_c0._M_head_impl;
            local_b0.type_._0_8_ = (DataChunk *)0x0;
            local_c0._M_head_impl = (DataChunk *)uVar3;
            if (_Var2._M_head_impl != (DataChunk *)0x0) {
              DataChunk::~DataChunk(_Var2._M_head_impl);
              operator_delete(_Var2._M_head_impl);
              uVar3 = local_b0.type_._0_8_;
              if ((DataChunk *)local_b0.type_._0_8_ != (DataChunk *)0x0) {
                DataChunk::~DataChunk((DataChunk *)local_b0.type_._0_8_);
                operator_delete((void *)uVar3);
              }
            }
            index = 0;
          }
          if (local_b8._M_head_impl == (DataChunk *)0x0) {
            if (local_c0._M_head_impl == (DataChunk *)0x0) {
              return true;
            }
            bVar4 = false;
            goto LAB_00fc0193;
          }
          if (local_c0._M_head_impl == (DataChunk *)0x0) {
            bVar4 = false;
            goto LAB_00fc01ad;
          }
          pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                   operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                               *)&local_b8);
          if ((pDVar5->count == 0) &&
             (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                   *)&local_c0), pDVar5->count == 0)) break;
          for (; (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                         *)&local_b8), index_00 < pDVar5->count &&
                 (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                         *)&local_c0), index < pDVar5->count)); index = index + 1) {
            for (col_idx = 0;
                pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                       *)&local_c0),
                col_idx < (ulong)(((long)(pDVar5->data).
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pDVar5->data).
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x4ec4ec4ec4ec4ec5); col_idx = col_idx + 1) {
              pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                   *)&local_b8);
              DataChunk::GetValue(&local_b0,pDVar5,col_idx,index_00);
              pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                   *)&local_c0);
              DataChunk::GetValue(&local_70,pDVar5,col_idx,index);
              if (((local_b0.is_null != true) || ((local_70.is_null & 1U) == 0)) &&
                 ((local_b0.is_null != local_70.is_null ||
                  (bVar4 = Value::operator!=(&local_b0,&local_70), bVar4)))) {
                Value::~Value(&local_70);
                Value::~Value(&local_b0);
                bVar4 = false;
                goto LAB_00fc0189;
              }
              Value::~Value(&local_70);
              Value::~Value(&local_b0);
            }
            index_00 = index_00 + 1;
          }
        }
        bVar4 = true;
LAB_00fc0189:
        if (local_c0._M_head_impl != (DataChunk *)0x0) {
LAB_00fc0193:
          _Var2._M_head_impl = local_c0._M_head_impl;
          DataChunk::~DataChunk(local_c0._M_head_impl);
          operator_delete(_Var2._M_head_impl);
        }
        if (local_b8._M_head_impl == (DataChunk *)0x0) {
          return bVar4;
        }
LAB_00fc01ad:
        _Var2._M_head_impl = local_b8._M_head_impl;
        DataChunk::~DataChunk(local_b8._M_head_impl);
        operator_delete(_Var2._M_head_impl);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool QueryResult::Equals(QueryResult &other) { // LCOV_EXCL_START
	// first compare the success state of the results
	if (success != other.success) {
		return false;
	}
	if (!success) {
		return error == other.error;
	}
	// compare names
	if (names != other.names) {
		return false;
	}
	// compare types
	if (types != other.types) {
		return false;
	}
	// now compare the actual values
	// fetch chunks
	unique_ptr<DataChunk> lchunk, rchunk;
	idx_t lindex = 0, rindex = 0;
	while (true) {
		if (!lchunk || lindex == lchunk->size()) {
			lchunk = Fetch();
			lindex = 0;
		}
		if (!rchunk || rindex == rchunk->size()) {
			rchunk = other.Fetch();
			rindex = 0;
		}
		if (!lchunk && !rchunk) {
			return true;
		}
		if (!lchunk || !rchunk) {
			return false;
		}
		if (lchunk->size() == 0 && rchunk->size() == 0) {
			return true;
		}
		D_ASSERT(lchunk->ColumnCount() == rchunk->ColumnCount());
		for (; lindex < lchunk->size() && rindex < rchunk->size(); lindex++, rindex++) {
			for (idx_t col = 0; col < rchunk->ColumnCount(); col++) {
				auto lvalue = lchunk->GetValue(col, lindex);
				auto rvalue = rchunk->GetValue(col, rindex);
				if (lvalue.IsNull() && rvalue.IsNull()) {
					continue;
				}
				if (lvalue.IsNull() != rvalue.IsNull()) {
					return false;
				}
				if (lvalue != rvalue) {
					return false;
				}
			}
		}
	}
}